

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mount_tree.c
# Opt level: O2

mount_tree_t * get_mount(char *full_path,char **name)

{
  char *value;
  mount_tree_t *pmVar1;
  mount_tree_t *pmVar2;
  
  if ((*full_path != '/') || (full_path[1] != '\0')) {
    value = strtok(full_path,"/");
    pmVar2 = &root;
    while (value != (char *)0x0) {
      if (name != (char **)0x0) {
        *name = value;
      }
      pmVar1 = (mount_tree_t *)
               find_in_curious_dynamic_array(&pmVar2->children,value,compare_mount_tree_by_name);
      if (pmVar1 == (mount_tree_t *)0x0) {
        return pmVar2;
      }
      value = strtok((char *)0x0,"/");
      pmVar2 = pmVar1;
    }
  }
  return &root;
}

Assistant:

mount_tree_t* get_mount(char* full_path, char** name)
{
    if (0 == strcmp(full_path, ROOT_PATH)) {
        return &root;
    }

    mount_tree_t* cur_mount = &root;
    mount_tree_t* next_mount;
#define DIR_SEP "/"
    // Look at every path elemet (i.e. each level of directories) in the full path...
    for (char* path_el = strtok(full_path, DIR_SEP); NULL != path_el; path_el = strtok(NULL, DIR_SEP)) {
        // The name should always be the last path element we've looked at
        if (NULL != name) {
            *name = path_el;
        }

        // ...see if there's a mount one level down which matches the current path element
        next_mount =
            find_in_curious_dynamic_array(&cur_mount->children, path_el, (compare_f) compare_mount_tree_by_name);
        // ...if we couldn't find a match, we've found the deepest relevant node,
        // meaning that we're done
        if (NULL == next_mount) {
            return cur_mount;

            // ...otherwise, we want to look at the childreen of the matching mount
        } else {
            cur_mount = next_mount;
        }
    }

    return &root;
}